

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardIO.cpp
# Opt level: O2

bool __thiscall BoardIO::WriteIPv4Address(BoardIO *this,uint32_t IPaddr)

{
  BasePort *pBVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  
  pBVar1 = this->port;
  if (pBVar1 != (BasePort *)0x0) {
    uVar4 = (ulong)this->BoardId;
    if ((uVar4 < 0x10) && (6 < (uint)pBVar1->FirmwareVersion[uVar4])) {
      iVar2 = (*pBVar1->_vptr_BasePort[0x24])(pBVar1,uVar4,0xb,IPaddr);
      return SUB41(iVar2,0);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,
                           "BoardIO::WriteIPv4Address: requires firmware 7 or above");
  std::endl<char,std::char_traits<char>>(poVar3);
  return false;
}

Assistant:

bool BoardIO::WriteIPv4Address(uint32_t IPaddr)
{
    if (GetFirmwareVersion() < 7) {
        std::cerr << "BoardIO::WriteIPv4Address: requires firmware 7 or above" << std::endl;
        return false;
    }
    return (port ? port->WriteQuadlet(BoardId, BoardIO::IP_ADDR, IPaddr) : false);
}